

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O0

int run_test_kill(void)

{
  int iVar1;
  __sighandler_t p_Var2;
  undefined8 uVar3;
  uv_loop_t *loop;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  sigset_t set_1;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  sigset_t set;
  int r;
  
  init_process_options("spawn_helper4",kill_cb);
  sigemptyset((sigset_t *)&eval_a);
  sigaddset((sigset_t *)&eval_a,0xf);
  iVar1 = pthread_sigmask(0,(__sigset_t *)&eval_a,(__sigset_t *)0x0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x41b,"pthread_sigmask(0, &set, ((void*)0))","==","0",(long)iVar1,"==",0);
    abort();
  }
  p_Var2 = signal(0xf,(__sighandler_t)0x1);
  if (p_Var2 == (__sighandler_t)0xffffffffffffffff) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x41d,"((__sighandler_t) -1)","!=","signal(15, ((__sighandler_t) 1))",
            0xffffffffffffffff,"!=",0xffffffffffffffff);
    abort();
  }
  uVar3 = uv_default_loop();
  set.__val[0xf]._4_4_ = uv_spawn(uVar3,&process,&options);
  set_1.__val[0xf] = 0;
  if ((long)set.__val[0xf]._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x421,"r","==","0",(long)set.__val[0xf]._4_4_,"==",0);
    abort();
  }
  sigemptyset((sigset_t *)&eval_a_3);
  sigaddset((sigset_t *)&eval_a_3,0xf);
  iVar1 = pthread_sigmask(1,(__sigset_t *)&eval_a_3,(__sigset_t *)0x0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x428,"pthread_sigmask(1, &set, ((void*)0))","==","0",(long)iVar1,"==",0);
    abort();
  }
  p_Var2 = signal(0xf,(__sighandler_t)0x0);
  if (p_Var2 == (__sighandler_t)0xffffffffffffffff) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x42a,"((__sighandler_t) -1)","!=","signal(15, ((__sighandler_t) 0))",
            0xffffffffffffffff,"!=",0xffffffffffffffff);
    abort();
  }
  set.__val[0xf]._4_4_ = uv_kill(process.pid,0);
  if ((long)set.__val[0xf]._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x431,"r","==","0",(long)set.__val[0xf]._4_4_,"==",0);
    abort();
  }
  set.__val[0xf]._4_4_ = uv_kill(process.pid,0xf);
  if ((long)set.__val[0xf]._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x435,"r","==","0",(long)set.__val[0xf]._4_4_,"==",0);
    abort();
  }
  uVar3 = uv_default_loop();
  set.__val[0xf]._4_4_ = uv_run(uVar3,0);
  if ((long)set.__val[0xf]._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x438,"r","==","0",(long)set.__val[0xf]._4_4_,"==",0);
    abort();
  }
  if ((long)exit_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x43a,"1","==","exit_cb_called",1,"==",(long)exit_cb_called);
    abort();
  }
  if ((long)close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x43b,"1","==","close_cb_called",1,"==",(long)close_cb_called);
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar3 = uv_default_loop();
  iVar1 = uv_loop_close(uVar3);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x43d,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(kill) {
  int r;

#ifdef _WIN32
  no_term_signal = 1;
#endif

  init_process_options("spawn_helper4", kill_cb);

  /* Verify that uv_spawn() resets the signal disposition. */
#ifndef _WIN32
  {
    sigset_t set;
    sigemptyset(&set);
    sigaddset(&set, SIGTERM);
    ASSERT_OK(pthread_sigmask(SIG_BLOCK, &set, NULL));
  }
  ASSERT_NE(SIG_ERR, signal(SIGTERM, SIG_IGN));
#endif

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT_OK(r);

#ifndef _WIN32
  {
    sigset_t set;
    sigemptyset(&set);
    sigaddset(&set, SIGTERM);
    ASSERT_OK(pthread_sigmask(SIG_UNBLOCK, &set, NULL));
  }
  ASSERT_NE(SIG_ERR, signal(SIGTERM, SIG_DFL));
#endif

  /* Sending signum == 0 should check if the
   * child process is still alive, not kill it.
   */
  r = uv_kill(process.pid, 0);
  ASSERT_OK(r);

  /* Kill the process. */
  r = uv_kill(process.pid, SIGTERM);
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}